

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O2

REF_STATUS
ref_part_node(FILE *file,REF_BOOL swap_endian,REF_INT version,REF_BOOL twod,REF_NODE ref_node,
             REF_LONG nnode)

{
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  int dest;
  int iVar3;
  REF_BOOL RVar4;
  REF_INT version_00;
  FILE *file_00;
  uint uVar5;
  REF_STATUS RVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  REF_MPI pRVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  REF_NODE pRVar19;
  REF_DBL *pRVar20;
  undefined8 uStack_a0;
  REF_DBL dbl;
  REF_INT n;
  REF_INT new_node;
  REF_NODE local_80;
  void *local_78;
  REF_BOOL local_70;
  REF_INT local_6c;
  REF_MPI local_68;
  FILE *local_60;
  long local_58;
  void *local_50;
  REF_NODE local_48;
  long local_40;
  REF_LONG id;
  
  pRVar13 = ref_node->ref_mpi;
  local_70 = twod;
  local_6c = version;
  uVar5 = ref_node_initialize_n_global(ref_node,nnode);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x4c,
           "ref_part_node",(ulong)uVar5,"init nnodesg");
    return uVar5;
  }
  local_78 = (void *)CONCAT44(local_78._4_4_,swap_endian);
  local_80 = ref_node;
  local_68 = pRVar13;
  local_60 = (FILE *)file;
  if (pRVar13->id == 0) {
    local_40 = nnode + -1;
    lVar17 = 0;
    local_58 = nnode;
    do {
      lVar18 = local_40;
      pRVar19 = local_80;
      iVar7 = pRVar13->n;
      lVar14 = (long)iVar7;
      lVar11 = local_58 - (local_40 / lVar14) * lVar14;
      if (lVar11 < 2) {
        lVar14 = ((lVar14 + local_40) / lVar14) * lVar11 + (1 - lVar11) * (local_40 / lVar14);
      }
      else {
        lVar14 = (lVar14 + local_40) / lVar14;
      }
      if (lVar14 <= lVar17) {
        pRVar19 = (REF_NODE)0x1;
        goto LAB_001d157a;
      }
      uVar5 = ref_node_add(local_80,lVar17,&new_node);
      pRVar13 = local_68;
      if (uVar5 != 0) {
        pcVar15 = "new_node";
        uStack_a0 = 0x52;
        goto LAB_001d1307;
      }
      pRVar19->part[new_node] = local_68->id;
      sVar8 = fread(&dbl,8,1,(FILE *)file);
      version_00 = local_6c;
      if (sVar8 != 1) {
        pcVar15 = "x";
        uStack_a0 = 0x54;
LAB_001d195a:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uStack_a0,"ref_part_node",pcVar15);
        return 1;
      }
      if ((int)local_78 != 0) {
        dbl = (REF_DBL)((ulong)dbl >> 0x38 | ((ulong)dbl & 0xff000000000000) >> 0x28 |
                        ((ulong)dbl & 0xff0000000000) >> 0x18 | ((ulong)dbl & 0xff00000000) >> 8 |
                        ((ulong)dbl & 0xff000000) << 8 | ((ulong)dbl & 0xff0000) << 0x18 |
                        ((ulong)dbl & 0xff00) << 0x28 | (long)dbl << 0x38);
      }
      local_80->real[(long)new_node * 0xf] = dbl;
      sVar8 = fread(&dbl,8,1,(FILE *)file);
      if (sVar8 != 1) {
        pcVar15 = "y";
        uStack_a0 = 0x57;
        goto LAB_001d195a;
      }
      if ((int)local_78 != 0) {
        dbl = (REF_DBL)((ulong)dbl >> 0x38 | ((ulong)dbl & 0xff000000000000) >> 0x28 |
                        ((ulong)dbl & 0xff0000000000) >> 0x18 | ((ulong)dbl & 0xff00000000) >> 8 |
                        ((ulong)dbl & 0xff000000) << 8 | ((ulong)dbl & 0xff0000) << 0x18 |
                        ((ulong)dbl & 0xff00) << 0x28 | (long)dbl << 0x38);
      }
      local_80->real[(long)new_node * 0xf + 1] = dbl;
      if (local_70 == 0) {
        sVar8 = fread(&dbl,8,1,(FILE *)file);
        if (sVar8 != 1) {
          pcVar15 = "z";
          uStack_a0 = 0x5b;
          goto LAB_001d195a;
        }
        if ((int)local_78 != 0) {
          dbl = (REF_DBL)((ulong)dbl >> 0x38 | ((ulong)dbl & 0xff000000000000) >> 0x28 |
                          ((ulong)dbl & 0xff0000000000) >> 0x18 | ((ulong)dbl & 0xff00000000) >> 8 |
                          ((ulong)dbl & 0xff000000) << 8 | ((ulong)dbl & 0xff0000) << 0x18 |
                          ((ulong)dbl & 0xff00) << 0x28 | (long)dbl << 0x38);
        }
      }
      else {
        dbl = 0.0;
      }
      local_80->real[(long)new_node * 0xf + 2] = dbl;
      if ((0 < version_00) && (RVar6 = ref_part_meshb_long(file,version_00,&id), RVar6 != 0))
      goto LAB_001d183a;
      lVar17 = lVar17 + 1;
    } while( true );
  }
  uVar5 = ref_mpi_scatter_recv(pRVar13,&n,1,1);
  if (uVar5 == 0) {
    if (0 < n) {
      iVar7 = n * 3;
      local_58 = nnode;
      pvVar9 = malloc((ulong)(uint)n * 0x18);
      pRVar13 = local_68;
      if (pvVar9 == (void *)0x0) {
        uStack_a0 = 0x82;
LAB_001d182c:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uStack_a0,"ref_part_node","malloc xyz of REF_DBL NULL");
        return 2;
      }
      uVar5 = ref_mpi_scatter_recv(local_68,pvVar9,iVar7,3);
      pRVar19 = local_80;
      if (uVar5 != 0) {
        pcVar15 = "recv";
        uStack_a0 = 0x83;
        goto LAB_001d1307;
      }
      lVar17 = local_58 + -1;
      pRVar20 = (REF_DBL *)((long)pvVar9 + 0x10);
      local_78 = pvVar9;
      for (lVar18 = 0; lVar18 < n; lVar18 = lVar18 + 1) {
        lVar14 = (long)pRVar13->id;
        lVar11 = (long)pRVar13->n;
        lVar16 = local_58 - (lVar17 / lVar11) * lVar11;
        if (lVar14 < lVar16) {
          lVar14 = ((lVar17 + lVar11) / lVar11) * lVar14;
        }
        else {
          lVar14 = ((lVar17 + lVar11) / lVar11) * lVar16 + (lVar14 - lVar16) * (lVar17 / lVar11);
        }
        uVar5 = ref_node_add(pRVar19,lVar14 + lVar18,&new_node);
        if (uVar5 != 0) {
          pcVar15 = "new_node";
          uStack_a0 = 0x89;
          goto LAB_001d1307;
        }
        pRVar19->part[new_node] = local_68->id;
        pRVar2 = pRVar19->real;
        lVar14 = (long)new_node;
        pRVar2[lVar14 * 0xf] = pRVar20[-2];
        pRVar2[lVar14 * 0xf + 1] = pRVar20[-1];
        pRVar2[lVar14 * 0xf + 2] = *pRVar20;
        pRVar20 = pRVar20 + 3;
        pRVar13 = local_68;
      }
      free(local_78);
    }
    return 0;
  }
  pcVar15 = "recv";
  uStack_a0 = 0x80;
LAB_001d1307:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uStack_a0,
         "ref_part_node",(ulong)uVar5,pcVar15);
  return uVar5;
LAB_001d157a:
  lVar17 = (long)iVar7;
  if (lVar17 <= (long)pRVar19) {
    return 0;
  }
  pRVar1 = (REF_NODE)((long)&pRVar19->n + 1);
  lVar14 = local_58 - (lVar18 / lVar17) * lVar17;
  iVar3 = (int)lVar14;
  iVar7 = (int)(lVar18 / lVar17);
  if ((long)pRVar1 < lVar14) {
    iVar10 = (int)((lVar17 + lVar18) / lVar17) * (int)pRVar1;
  }
  else {
    iVar10 = (int)((lVar17 + lVar18) / lVar17) * iVar3 + ((int)pRVar1 - iVar3) * iVar7;
  }
  dest = (int)pRVar19;
  if ((long)pRVar19 < lVar14) {
    iVar7 = (int)((lVar17 + lVar18) / lVar17) * dest;
  }
  else {
    iVar7 = (int)((lVar17 + lVar18) / lVar17) * iVar3 + (dest - iVar3) * iVar7;
  }
  n = iVar10 - iVar7;
  uVar5 = ref_mpi_scatter_send(local_68,&n,1,1,dest);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x66,
           "ref_part_node",(ulong)uVar5,"send");
    return uVar5;
  }
  uVar12 = (ulong)(uint)n;
  local_80 = pRVar1;
  local_48 = pRVar19;
  if (0 < n) {
    pvVar9 = malloc(uVar12 * 0x18);
    if (pvVar9 == (void *)0x0) {
      uStack_a0 = 0x68;
      goto LAB_001d182c;
    }
    pRVar20 = (REF_DBL *)((long)pvVar9 + 0x10);
    local_50 = pvVar9;
    for (lVar17 = 0; pvVar9 = local_50, lVar17 < (int)uVar12; lVar17 = lVar17 + 1) {
      sVar8 = fread(&dbl,8,1,local_60);
      RVar4 = local_70;
      if (sVar8 != 1) {
        pcVar15 = "x";
        uStack_a0 = 0x6a;
LAB_001d1a28:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uStack_a0,"ref_part_node",pcVar15);
        return 1;
      }
      if ((int)local_78 != 0) {
        dbl = (REF_DBL)((ulong)dbl >> 0x38 | ((ulong)dbl & 0xff000000000000) >> 0x28 |
                        ((ulong)dbl & 0xff0000000000) >> 0x18 | ((ulong)dbl & 0xff00000000) >> 8 |
                        ((ulong)dbl & 0xff000000) << 8 | ((ulong)dbl & 0xff0000) << 0x18 |
                        ((ulong)dbl & 0xff00) << 0x28 | (long)dbl << 0x38);
      }
      pRVar20[-2] = dbl;
      sVar8 = fread(&dbl,8,1,local_60);
      file_00 = local_60;
      if (sVar8 != 1) {
        pcVar15 = "y";
        uStack_a0 = 0x6d;
        goto LAB_001d1a28;
      }
      if ((int)local_78 != 0) {
        dbl = (REF_DBL)((ulong)dbl >> 0x38 | ((ulong)dbl & 0xff000000000000) >> 0x28 |
                        ((ulong)dbl & 0xff0000000000) >> 0x18 | ((ulong)dbl & 0xff00000000) >> 8 |
                        ((ulong)dbl & 0xff000000) << 8 | ((ulong)dbl & 0xff0000) << 0x18 |
                        ((ulong)dbl & 0xff00) << 0x28 | (long)dbl << 0x38);
      }
      pRVar20[-1] = dbl;
      if (RVar4 == 0) {
        sVar8 = fread(&dbl,8,1,local_60);
        if (sVar8 != 1) {
          pcVar15 = "z";
          uStack_a0 = 0x71;
          goto LAB_001d1a28;
        }
        if ((int)local_78 != 0) {
          dbl = (REF_DBL)((ulong)dbl >> 0x38 | ((ulong)dbl & 0xff000000000000) >> 0x28 |
                          ((ulong)dbl & 0xff0000000000) >> 0x18 | ((ulong)dbl & 0xff00000000) >> 8 |
                          ((ulong)dbl & 0xff000000) << 8 | ((ulong)dbl & 0xff0000) << 0x18 |
                          ((ulong)dbl & 0xff00) << 0x28 | (long)dbl << 0x38);
        }
      }
      else {
        dbl = 0.0;
      }
      *pRVar20 = dbl;
      if ((0 < local_6c) && (RVar6 = ref_part_meshb_long((FILE *)file_00,local_6c,&id), RVar6 != 0))
      {
        uStack_a0 = 0x78;
        goto LAB_001d1a01;
      }
      uVar12 = (ulong)(uint)n;
      pRVar20 = pRVar20 + 3;
    }
    uVar5 = ref_mpi_scatter_send(local_68,local_50,(int)uVar12 * 3,3,(REF_INT)local_48);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7b,
             "ref_part_node",(ulong)uVar5,"send");
      return uVar5;
    }
    free(pvVar9);
  }
  iVar7 = local_68->n;
  pRVar19 = local_80;
  goto LAB_001d157a;
LAB_001d183a:
  uStack_a0 = 0x61;
LAB_001d1a01:
  pcVar15 = "nnode";
  uVar5 = 1;
  goto LAB_001d1307;
}

Assistant:

REF_FCN static REF_STATUS ref_part_node(FILE *file, REF_BOOL swap_endian,
                                        REF_INT version, REF_BOOL twod,
                                        REF_NODE ref_node, REF_LONG nnode) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT node, new_node;
  REF_INT part;
  REF_INT n;
  REF_LONG id;
  REF_DBL dbl;
  REF_DBL *xyz;

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init nnodesg");

  if (ref_mpi_once(ref_mpi)) {
    part = 0;
    for (node = 0; node < ref_part_first(nnode, ref_mpi_n(ref_mpi), 1);
         node++) {
      RSS(ref_node_add(ref_node, node, &new_node), "new_node");
      ref_node_part(ref_node, new_node) = ref_mpi_rank(ref_mpi);
      RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "x");
      if (swap_endian) SWAP_DBL(dbl);
      ref_node_xyz(ref_node, 0, new_node) = dbl;
      RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "y");
      if (swap_endian) SWAP_DBL(dbl);
      ref_node_xyz(ref_node, 1, new_node) = dbl;
      if (!twod) {
        RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "z");
        if (swap_endian) SWAP_DBL(dbl);
      } else {
        dbl = 0.0;
      }
      ref_node_xyz(ref_node, 2, new_node) = dbl;
      if (version > 0) RSS(ref_part_meshb_long(file, version, &id), "nnode");
    }
    each_ref_mpi_worker(ref_mpi, part) {
      n = (REF_INT)(ref_part_first(nnode, ref_mpi_n(ref_mpi), part + 1) -
                    ref_part_first(nnode, ref_mpi_n(ref_mpi), part));
      RSS(ref_mpi_scatter_send(ref_mpi, &n, 1, REF_INT_TYPE, part), "send");
      if (n > 0) {
        ref_malloc(xyz, 3 * n, REF_DBL);
        for (node = 0; node < n; node++) {
          RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "x");
          if (swap_endian) SWAP_DBL(dbl);
          xyz[0 + 3 * node] = dbl;
          RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "y");
          if (swap_endian) SWAP_DBL(dbl);
          xyz[1 + 3 * node] = dbl;
          if (!twod) {
            RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "z");
            if (swap_endian) SWAP_DBL(dbl);
          } else {
            dbl = 0.0;
          }
          xyz[2 + 3 * node] = dbl;
          if (version > 0)
            RSS(ref_part_meshb_long(file, version, &id), "nnode");
        }
        RSS(ref_mpi_scatter_send(ref_mpi, xyz, 3 * n, REF_DBL_TYPE, part),
            "send");
        free(xyz);
      }
    }
  } else {
    RSS(ref_mpi_scatter_recv(ref_mpi, &n, 1, REF_INT_TYPE), "recv");
    if (n > 0) {
      ref_malloc(xyz, 3 * n, REF_DBL);
      RSS(ref_mpi_scatter_recv(ref_mpi, xyz, 3 * n, REF_DBL_TYPE), "recv");
      for (node = 0; node < n; node++) {
        RSS(ref_node_add(ref_node,
                         node + ref_part_first(nnode, ref_mpi_n(ref_mpi),
                                               ref_mpi_rank(ref_mpi)),
                         &new_node),
            "new_node");
        ref_node_part(ref_node, new_node) = ref_mpi_rank(ref_mpi);
        ref_node_xyz(ref_node, 0, new_node) = xyz[0 + 3 * node];
        ref_node_xyz(ref_node, 1, new_node) = xyz[1 + 3 * node];
        ref_node_xyz(ref_node, 2, new_node) = xyz[2 + 3 * node];
      }
      free(xyz);
    }
  }

  return REF_SUCCESS;
}